

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O1

void __thiscall CSounds::Play(CSounds *this,int Chn,int SetId,float Vol)

{
  CGameClient *pCVar1;
  ISound *pIVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  CSampleHandle CVar3;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  if ((pCVar1->m_SuppressEvents == false) && ((Chn != 1 || (pCVar1->m_pConfig->m_SndMusic != 0)))) {
    CVar3 = GetSampleId(this,SetId);
    if (-1 < CVar3.m_Id) {
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pSound;
      UNRECOVERED_JUMPTABLE = (pIVar2->super_IInterface)._vptr_IInterface[8];
      (*UNRECOVERED_JUMPTABLE)
                (pIVar2,Chn,(ulong)(uint)CVar3.m_Id,(ulong)(Chn == 1),UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void CSounds::Play(int Chn, int SetId, float Vol)
{
	if(m_pClient->m_SuppressEvents)
		return;
	if(Chn == CHN_MUSIC && !Config()->m_SndMusic)
		return;

	ISound::CSampleHandle SampleId = GetSampleId(SetId);
	if(!SampleId.IsValid())
		return;

	int Flags = 0;
	if(Chn == CHN_MUSIC)
		Flags = ISound::FLAG_LOOP;

	Sound()->Play(Chn, SampleId, Flags);
}